

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

bool QFontDatabase::isFixedPitch(QString *family,QString *style)

{
  long lVar1;
  QtFontFamily *pQVar2;
  long in_FS_OFFSET;
  QtFontFamily *f;
  QFontDatabasePrivate *d;
  QString foundryName;
  QString familyName;
  QMutexLocker<QRecursiveMutex> locker;
  QRecursiveMutex *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  byte bVar3;
  QString *family_00;
  QString *foundry;
  FamilyRequestFlags flags;
  QString *name;
  QFontDatabasePrivate *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  name = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  this = (QFontDatabasePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x74210e);
  family_00 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  foundry = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x74213c);
  parseFontName(name,foundry,family_00);
  flags = (FamilyRequestFlags)((ulong)foundry >> 0x20);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
              *)in_stack_ffffffffffffff88);
  QMutexLocker<QRecursiveMutex>::QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)
             CONCAT17(in_stack_ffffffffffffff97,
                      CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
             in_stack_ffffffffffffff88);
  QFontDatabasePrivate::ensureFontDatabase();
  pQVar2 = QFontDatabasePrivate::family(this,name,flags);
  bVar3 = 0;
  if (pQVar2 != (QtFontFamily *)0x0) {
    bVar3 = *(byte *)pQVar2 >> 1 & 1;
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)
             CONCAT17(bVar3,CONCAT16(bVar3,in_stack_ffffffffffffff90)));
  QString::~QString((QString *)0x7421dd);
  QString::~QString((QString *)0x7421e7);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QFontDatabase::isFixedPitch(const QString &family,
                                 const QString &style)
{
    Q_UNUSED(style);

    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QtFontFamily *f = d->family(familyName);
    return (f && f->fixedPitch);
}